

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cpp
# Opt level: O0

int __thiscall ncnn::Quantize::forward(Quantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  char cVar1;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar2;
  int i_3;
  float scale_2;
  char *outptr_1;
  float *ptr_1;
  int q;
  int size;
  int channels;
  int h_1;
  int w_2;
  int j;
  float scale_1;
  char *outptr0;
  float *ptr0;
  int i_2;
  int h;
  int w_1;
  int i_1;
  int i;
  float scale;
  char *outptr;
  float *ptr;
  int w;
  int dims;
  Mat *m;
  Mat *m_1;
  float in_stack_fffffffffffffbe0;
  Allocator *in_stack_fffffffffffffbe8;
  Allocator *in_stack_fffffffffffffbf0;
  size_t in_stack_fffffffffffffbf8;
  Mat *in_stack_fffffffffffffc00;
  undefined8 in_stack_fffffffffffffc08;
  Mat *in_stack_fffffffffffffc10;
  undefined4 local_3bc;
  int local_390;
  undefined8 local_388;
  undefined8 local_380;
  undefined8 local_378;
  undefined4 local_370;
  long local_368;
  undefined4 local_360;
  undefined4 local_35c;
  undefined4 local_358;
  undefined4 local_354;
  undefined4 local_350;
  undefined8 local_348;
  long local_340;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 local_318;
  undefined4 local_310;
  long local_308;
  undefined4 local_300;
  undefined4 local_2fc;
  undefined4 local_2f8;
  undefined4 local_2f4;
  undefined4 local_2f0;
  undefined8 local_2e8;
  long local_2e0;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  int local_2c0;
  undefined4 local_2bc;
  long local_2b8;
  long local_2b0;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  int local_298;
  undefined4 local_294;
  long local_290;
  long local_288;
  int local_280;
  int local_27c;
  long *local_270;
  long *local_268;
  undefined8 *local_250;
  undefined8 *local_240;
  long *local_230;
  long *local_228;
  long *local_220;
  undefined8 *local_218;
  long *local_210;
  undefined8 *local_208;
  long *local_200;
  long local_1f8;
  long local_1f0;
  undefined8 local_1e8;
  long local_1e0;
  long local_1d8;
  long *local_1d0;
  undefined8 local_1c8;
  undefined8 *local_1c0;
  long local_1b8;
  long local_1b0;
  undefined8 local_1a8;
  undefined8 *local_1a0;
  int local_194;
  long *local_190;
  int local_184;
  long *local_180;
  undefined1 local_175;
  int local_174;
  undefined8 *local_168;
  undefined1 local_155;
  int local_154;
  undefined8 *local_148;
  undefined8 *local_100;
  undefined8 *local_e0;
  long *local_a8;
  long *local_a0;
  long *local_98;
  long local_90;
  undefined4 local_84;
  long local_80;
  long local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  long local_58;
  undefined4 local_4c;
  long local_48;
  long local_40;
  undefined4 local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_27c = (int)in_RSI[5];
  local_270 = in_RDX;
  local_268 = in_RSI;
  if (local_27c == 1) {
    local_280 = *(int *)((long)in_RSI + 0x2c);
    Mat::create(in_stack_fffffffffffffc00,(int)(in_stack_fffffffffffffbf8 >> 0x20),
                (size_t)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    local_220 = local_270;
    bVar2 = true;
    if (*local_270 != 0) {
      local_a8 = local_270;
      bVar2 = local_270[8] * (long)(int)local_270[7] == 0;
    }
    if (bVar2) {
      return -100;
    }
    local_210 = local_268;
    local_288 = *local_268;
    local_200 = local_270;
    local_290 = *local_270;
    if (*(int *)(in_RDI + 0xd0) == 1) {
      local_1a0 = (undefined8 *)(in_RDI + 0xd8);
      local_1a8 = 0;
      local_294 = *(undefined4 *)*local_1a0;
      for (local_298 = 0; local_298 < local_280; local_298 = local_298 + 1) {
        cVar1 = float2int8(in_stack_fffffffffffffbe0);
        *(char *)(local_290 + local_298) = cVar1;
      }
    }
    else {
      for (local_29c = 0; local_29c < local_280; local_29c = local_29c + 1) {
        local_1b0 = in_RDI + 0xd8;
        local_1b8 = (long)local_29c;
        cVar1 = float2int8(in_stack_fffffffffffffbe0);
        *(char *)(local_290 + local_29c) = cVar1;
      }
    }
  }
  if (local_27c == 2) {
    local_2a0 = *(int *)((long)local_268 + 0x2c);
    local_2a4 = (int)local_268[6];
    Mat::create(in_stack_fffffffffffffc00,(int)(in_stack_fffffffffffffbf8 >> 0x20),
                (int)in_stack_fffffffffffffbf8,(size_t)in_stack_fffffffffffffbf0,
                in_stack_fffffffffffffbe8);
    local_228 = local_270;
    bVar2 = true;
    if (*local_270 != 0) {
      local_a0 = local_270;
      bVar2 = local_270[8] * (long)(int)local_270[7] == 0;
    }
    if (bVar2) {
      return -100;
    }
    for (local_2a8 = 0; local_2a8 < local_2a4; local_2a8 = local_2a8 + 1) {
      local_190 = local_268;
      local_194 = local_2a8;
      local_2b0 = *local_268 +
                  (long)*(int *)((long)local_268 + 0x2c) * (long)local_2a8 * local_268[2];
      local_180 = local_270;
      local_184 = local_2a8;
      local_2b8 = *local_270 +
                  (long)*(int *)((long)local_270 + 0x2c) * (long)local_2a8 * local_270[2];
      if (*(int *)(in_RDI + 0xd0) == 1) {
        local_1c0 = (undefined8 *)(in_RDI + 0xd8);
        local_1c8 = 0;
        local_3bc = *(undefined4 *)*local_1c0;
      }
      else {
        local_1d0 = (long *)(in_RDI + 0xd8);
        local_1d8 = (long)local_2a8;
        local_3bc = *(undefined4 *)(*local_1d0 + local_1d8 * 4);
      }
      local_2bc = local_3bc;
      for (local_2c0 = 0; local_2c0 < local_2a0; local_2c0 = local_2c0 + 1) {
        cVar1 = float2int8(in_stack_fffffffffffffbe0);
        *(char *)(local_2b8 + local_2c0) = cVar1;
      }
    }
  }
  if (local_27c == 3) {
    local_2c4 = *(int *)((long)local_268 + 0x2c);
    local_2c8 = (int)local_268[6];
    local_2cc = (int)local_268[7];
    local_2d0 = local_2c4 * local_2c8;
    Mat::create(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                (int)in_stack_fffffffffffffc08,(int)((ulong)in_stack_fffffffffffffc00 >> 0x20),
                in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    local_230 = local_270;
    bVar2 = true;
    if (*local_270 != 0) {
      local_98 = local_270;
      bVar2 = local_270[8] * (long)(int)local_270[7] == 0;
    }
    if (bVar2) {
      return -100;
    }
    for (local_2d4 = 0; local_2d4 < local_2cc; local_2d4 = local_2d4 + 1) {
      local_168 = &local_328;
      local_2c = *(int *)((long)local_268 + 0x2c);
      local_30 = (int)local_268[6];
      local_34 = *(undefined4 *)((long)local_268 + 0x34);
      local_2e0 = *local_268 + local_268[8] * (long)local_2d4 * local_268[2];
      local_48 = local_268[2];
      local_4c = (undefined4)local_268[3];
      local_58 = local_268[4];
      local_28 = &local_328;
      local_18 = (long)local_2c * (long)local_30 * local_48;
      local_218 = &local_328;
      local_250 = &local_328;
      local_1c = 0x10;
      local_174 = local_2d4;
      local_175 = 1;
      local_328 = 0;
      local_318 = 0;
      local_310 = 0;
      local_300 = 0;
      local_2fc = 0;
      local_2f8 = 0;
      local_2f4 = 0;
      local_2f0 = 0;
      local_2e8 = 0;
      local_320 = 0;
      local_148 = &local_388;
      local_64 = *(int *)((long)local_270 + 0x2c);
      local_68 = (int)local_270[6];
      local_6c = *(undefined4 *)((long)local_270 + 0x34);
      local_340 = *local_270 + local_270[8] * (long)local_2d4 * local_270[2];
      local_80 = local_270[2];
      local_84 = (undefined4)local_270[3];
      local_90 = local_270[4];
      local_60 = &local_388;
      local_8 = (long)local_64 * (long)local_68 * local_80;
      local_208 = &local_388;
      local_240 = &local_388;
      local_c = 0x10;
      local_154 = local_2d4;
      local_155 = 1;
      local_388 = 0;
      local_378 = 0;
      local_370 = 0;
      local_360 = 0;
      local_35c = 0;
      local_358 = 0;
      local_354 = 0;
      local_350 = 0;
      local_348 = 0;
      local_380 = 0;
      if (*(int *)(in_RDI + 0xd0) == 1) {
        local_1e0 = in_RDI + 0xd8;
        local_1e8 = 0;
      }
      else {
        local_1f0 = in_RDI + 0xd8;
        local_1f8 = (long)local_2d4;
      }
      local_100 = local_240;
      local_e0 = local_250;
      local_78 = local_340;
      local_40 = local_2e0;
      local_368 = local_90;
      local_308 = local_58;
      for (local_390 = 0; local_390 < local_2d0; local_390 = local_390 + 1) {
        cVar1 = float2int8(in_stack_fffffffffffffbe0);
        *(char *)(local_340 + local_390) = cVar1;
      }
    }
  }
  return 0;
}

Assistant:

int Quantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        top_blob.create(w, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const float* ptr = bottom_blob;
        signed char* outptr = top_blob;

        if (scale_data_size == 1)
        {
            const float scale = scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                outptr[i] = float2int8(ptr[i] * scale);
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                outptr[i] = float2int8(ptr[i] * scale_data[i]);
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        top_blob.create(w, h, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            const float* ptr0 = bottom_blob.row(i);
            signed char* outptr0 = top_blob.row<signed char>(i);

            const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[i];

            for (int j = 0; j < w; j++)
            {
                outptr0[j] = float2int8(ptr0[j] * scale);
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        top_blob.create(w, h, channels, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            signed char* outptr = top_blob.channel(q);

            const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[q];

            for (int i = 0; i < size; i++)
            {
                outptr[i] = float2int8(ptr[i] * scale);
            }
        }
    }

    return 0;
}